

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConvertVisitor.cpp
# Opt level: O3

void __thiscall CConvertVisitor::Visit(CConvertVisitor *this,CNumExp *exp)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint __val;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint __len;
  string __str;
  string local_50;
  
  PositionInfo::GetStringPosition_abi_cxx11_
            (&local_50,&(exp->super_IExpression).super_PositionedNode.position);
  std::__cxx11::string::_M_append((char *)&this->code,(ulong)local_50._M_dataplus._M_p);
  paVar1 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  uVar2 = exp->number;
  __val = -uVar2;
  if (0 < (int)uVar2) {
    __val = uVar2;
  }
  __len = 1;
  if (9 < __val) {
    uVar5 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar4 = (uint)uVar5;
      if (uVar4 < 100) {
        __len = __len - 2;
        goto LAB_00113931;
      }
      if (uVar4 < 1000) {
        __len = __len - 1;
        goto LAB_00113931;
      }
      if (uVar4 < 10000) goto LAB_00113931;
      uVar5 = uVar5 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar4);
    __len = __len + 1;
  }
LAB_00113931:
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_50._M_dataplus._M_p + (uVar2 >> 0x1f),__len,__val);
  std::__cxx11::string::_M_append((char *)&this->code,(ulong)local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CConvertVisitor::Visit(CNumExp &exp) {
	this->code += exp.position.GetStringPosition();
	this->code += std::to_string(exp.number);
}